

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int cmCTest::HTTPRequest
              (string *url,HTTPMethod method,string *response,string *fields,string *putFile,
              int timeout)

{
  bool bVar1;
  CURLcode CVar2;
  CURL_conflict *data;
  FILE *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  curl_global_init(3);
  data = curl_easy_init();
  cmCurlSetCAInfo_abi_cxx11_(&local_50,data,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  if (method != HTTP_GET) {
    if (method != HTTP_PUT) {
      if (method == HTTP_POST) {
        curl_easy_setopt(data,CURLOPT_POST,1);
        curl_easy_setopt(data,CURLOPT_POSTFIELDS,(fields->_M_dataplus)._M_p);
      }
      goto LAB_002d91fc;
    }
    bVar1 = cmsys::SystemTools::FileExists((putFile->_M_dataplus)._M_p);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)response);
      std::operator+(&local_70,putFile," does not exist.\n");
      std::__cxx11::string::append((string *)response);
      std::__cxx11::string::~string((string *)&local_70);
      return -1;
    }
    curl_easy_setopt(data,CURLOPT_PUT,1);
    pFVar3 = cmsys::SystemTools::Fopen(putFile,"rb");
    curl_easy_setopt(data,CURLOPT_READDATA,pFVar3);
  }
  if (fields->_M_string_length != 0) {
    std::operator+(&local_70,"?",fields);
    std::__cxx11::string::append((string *)url);
    std::__cxx11::string::~string((string *)&local_70);
  }
LAB_002d91fc:
  curl_easy_setopt(data,CURLOPT_URL,(url->_M_dataplus)._M_p);
  curl_easy_setopt(data,CURLOPT_TIMEOUT,(ulong)(uint)timeout);
  curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
  curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,HTTPResponseCallback);
  curl_easy_setopt(data,CURLOPT_WRITEDATA,response);
  curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
  CVar2 = curl_easy_perform(data);
  curl_easy_cleanup(data);
  curl_global_cleanup();
  return CVar2;
}

Assistant:

int cmCTest::HTTPRequest(std::string url, HTTPMethod method,
                         std::string& response, std::string const& fields,
                         std::string const& putFile, int timeout)
{
  CURL* curl;
  FILE* file;
  ::curl_global_init(CURL_GLOBAL_ALL);
  curl = ::curl_easy_init();
  cmCurlSetCAInfo(curl);

  // set request options based on method
  switch (method) {
    case cmCTest::HTTP_POST:
      ::curl_easy_setopt(curl, CURLOPT_POST, 1);
      ::curl_easy_setopt(curl, CURLOPT_POSTFIELDS, fields.c_str());
      break;
    case cmCTest::HTTP_PUT:
      if (!cmSystemTools::FileExists(putFile.c_str())) {
        response = "Error: File ";
        response += putFile + " does not exist.\n";
        return -1;
      }
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      file = cmsys::SystemTools::Fopen(putFile, "rb");
      ::curl_easy_setopt(curl, CURLOPT_INFILE, file);
      // fall through to append GET fields
      CM_FALLTHROUGH;
    case cmCTest::HTTP_GET:
      if (!fields.empty()) {
        url += "?" + fields;
      }
      break;
  }

  ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
  ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

  // set response options
  ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, HTTPResponseCallback);
  ::curl_easy_setopt(curl, CURLOPT_FILE, (void*)&response);
  ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);

  CURLcode res = ::curl_easy_perform(curl);

  ::curl_easy_cleanup(curl);
  ::curl_global_cleanup();

  return static_cast<int>(res);
}